

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O2

Vec3<double> * Imath_2_5::rgb2hsv_d(Vec3<double> *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vec3<double> *in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = c->x;
  dVar2 = c->y;
  dVar3 = c->z;
  dVar4 = dVar1;
  if (dVar1 <= dVar2) {
    dVar4 = dVar2;
  }
  if (dVar4 <= dVar3) {
    dVar4 = dVar3;
  }
  dVar6 = dVar1;
  if (dVar2 <= dVar1) {
    dVar6 = dVar2;
  }
  if (dVar3 <= dVar6) {
    dVar6 = dVar3;
  }
  dVar6 = dVar4 - dVar6;
  dVar7 = 0.0;
  dVar5 = (double)(-(ulong)(dVar4 != 0.0) & (ulong)(dVar6 / dVar4));
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
      if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar4))) {
        dVar6 = (dVar1 - dVar2) / dVar6 + 4.0;
      }
      else {
        dVar6 = (dVar3 - dVar1) / dVar6 + 2.0;
      }
    }
    else {
      dVar6 = (dVar2 - dVar3) / dVar6;
    }
    dVar6 = dVar6 / 6.0;
    dVar7 = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                    (ulong)(dVar6 + 1.0) & -(ulong)(dVar6 < 0.0));
  }
  in_RDI->x = dVar7;
  in_RDI->y = dVar5;
  in_RDI->z = dVar4;
  return in_RDI;
}

Assistant:

Vec3<double>
rgb2hsv_d(const Vec3<double> &c)
{
    const double &x = c.x;
    const double &y = c.y;
    const double &z = c.z;

    double max	 = (x > y) ? ((x > z) ? x : z) : ((y > z) ? y : z);
    double min	 = (x < y) ? ((x < z) ? x : z) : ((y < z) ? y : z);
    double range = max - min;
    double val	 = max;
    double sat   = 0;
    double hue   = 0;
    
    if (max != 0)   sat = range/max;
    
    if (sat != 0) 
    {
	double h;
	
	if      (x == max)	h =     (y - z) / range;
	else if (y == max)	h = 2 + (z - x) / range;
	else		h = 4 + (x - y) / range;

	hue = h/6.;
	    
	if (hue < 0.)
	    hue += 1.0;
    }
    return Vec3<double>(hue,sat,val);
}